

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall
CTcTokenizer::expand_macros_curline
          (CTcTokenizer *this,int read_more,int allow_defined,int append_to_expbuf)

{
  int iVar1;
  byte *in_RDI;
  CTcTokenizer *unaff_retaddr;
  int err;
  int in_stack_00000248;
  int in_stack_0000024c;
  CTcTokString *in_stack_00000250;
  utf8_ptr *in_stack_00000258;
  CTcTokString *in_stack_00000260;
  CTcTokenizer *in_stack_00000268;
  int in_stack_00000290;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = expand_macros(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
                        in_stack_0000024c,in_stack_00000248,in_stack_00000290);
  if ((iVar1 == 0) && ((*in_RDI >> 2 & 1) != 0)) {
    remove_expansion_flags
              (unaff_retaddr,
               (CTcTokString *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar1;
}

Assistant:

int CTcTokenizer::expand_macros_curline(int read_more, int allow_defined,
                                        int append_to_expbuf)
{
    int err;
    
    /* expand macros in the current line */
    err = expand_macros(&linebuf_, &p_, &expbuf_, read_more, allow_defined,
                        append_to_expbuf);

    /* if that failed, return an error */
    if (err != 0)
        return err;

    /* 
     *   if we're in preprocessor mode, clean up the text for human
     *   consumption by removing our various expansion flags
     */
    if (pp_only_mode_)
        remove_expansion_flags(&expbuf_);

    /* return the result */
    return err;
}